

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* google::protobuf::compiler::cpp::anon_unknown_2::MessageKnownNonNullaryMethodsSnakeCase(void)

{
  int iVar1;
  flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *this;
  char **ppcVar2;
  char **ppcVar3;
  allocator<std::basic_string_view<char,_std::char_traits<char>_>_> local_17;
  key_equal local_16;
  hasher local_15 [13];
  
  if (cpp::(anonymous_namespace)::MessageKnownNonNullaryMethodsSnakeCase()::methods == '\0') {
    iVar1 = __cxa_guard_acquire(&cpp::(anonymous_namespace)::
                                 MessageKnownNonNullaryMethodsSnakeCase()::methods);
    if (iVar1 != 0) {
      this = (flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
              *)operator_new(0x20);
      ppcVar2 = std::begin<char_const*const,1ul>
                          (&MessageKnownNonNullaryMethodsSnakeCase::kMessageKnownMethods);
      ppcVar3 = std::end<char_const*const,1ul>
                          (&MessageKnownNonNullaryMethodsSnakeCase::kMessageKnownMethods);
      std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::allocator(&local_17);
      absl::lts_20250127::
      flat_hash_set<std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::raw_hash_set<char_const*const*>(this,ppcVar2,ppcVar3,0,local_15,&local_16,&local_17);
      std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>::~allocator(&local_17);
      MessageKnownNonNullaryMethodsSnakeCase::methods =
           (flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)this;
      __cxa_guard_release(&cpp::(anonymous_namespace)::MessageKnownNonNullaryMethodsSnakeCase()::
                           methods);
    }
  }
  return MessageKnownNonNullaryMethodsSnakeCase::methods;
}

Assistant:

const absl::flat_hash_set<absl::string_view>&
MessageKnownNonNullaryMethodsSnakeCase() {
  static constexpr const char* kMessageKnownMethods[] = {
      "swap",
  };
  static const auto* const methods = new absl::flat_hash_set<absl::string_view>(
      std::begin(kMessageKnownMethods), std::end(kMessageKnownMethods));
  return *methods;
}